

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O1

void copysymbolinfo(MOJOSHADER_symbolTypeInfo *dst,MOJOSHADER_symbolTypeInfo *src,
                   MOJOSHADER_malloc m,void *d)

{
  uint uVar1;
  MOJOSHADER_symbolStructMember *pMVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  
  dst->parameter_class = src->parameter_class;
  dst->parameter_type = src->parameter_type;
  dst->rows = src->rows;
  dst->columns = src->columns;
  dst->elements = src->elements;
  uVar1 = src->member_count;
  dst->member_count = uVar1;
  if (uVar1 != 0) {
    pMVar2 = (MOJOSHADER_symbolStructMember *)(*m)(uVar1 * 0x28,d);
    dst->members = pMVar2;
    if (dst->member_count != 0) {
      lVar6 = 8;
      uVar5 = 0;
      do {
        pcVar4 = *(char **)((long)src->members + lVar6 + -8);
        if (pcVar4 != (char *)0x0) {
          sVar3 = strlen(pcVar4);
          pcVar4 = (char *)(*m)((int)sVar3 + 1,d);
          strcpy(pcVar4,*(char **)((long)src->members + lVar6 + -8));
          *(char **)((long)dst->members + lVar6 + -8) = pcVar4;
        }
        copysymbolinfo((MOJOSHADER_symbolTypeInfo *)((long)&dst->members->name + lVar6),
                       (MOJOSHADER_symbolTypeInfo *)((long)&src->members->name + lVar6),m,d);
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x28;
      } while (uVar5 < dst->member_count);
    }
  }
  return;
}

Assistant:

void copysymbolinfo(MOJOSHADER_symbolTypeInfo *dst,
                    MOJOSHADER_symbolTypeInfo *src,
                    MOJOSHADER_malloc m,
                    void *d)
{
    int i;
    uint32 siz;
    char *stringcopy;

    dst->parameter_class = src->parameter_class;
    dst->parameter_type = src->parameter_type;
    dst->rows = src->rows;
    dst->columns = src->columns;
    dst->elements = src->elements;
    dst->member_count = src->member_count;

    if (dst->member_count > 0)
    {
        siz = sizeof (MOJOSHADER_symbolStructMember) * dst->member_count;
        dst->members = (MOJOSHADER_symbolStructMember *) m(siz, d);
        // !!! FIXME: Out of memory check!
        for (i = 0; i < dst->member_count; i++)
        {
            if (src->members[i].name != NULL)
            {
                siz = strlen(src->members[i].name) + 1;
                stringcopy = (char *) m(siz, d);
                strcpy(stringcopy, src->members[i].name);
                dst->members[i].name = stringcopy;
            } // if
            copysymbolinfo(&dst->members[i].info, &src->members[i].info, m, d);
        } // for
    } // if
}